

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int lws_h2_update_peer_txcredit(lws *wsi,int sid,int bump)

{
  lws *wsi_00;
  lws_h2_protocol_send *plVar1;
  lws_h2_protocol_send *pps;
  lws *nwsi;
  int bump_local;
  int sid_local;
  lws *wsi_local;
  
  wsi_00 = lws_get_network_wsi(wsi);
  if (wsi != (lws *)0x0) {
    if (bump == 0) {
      wsi_local._4_4_ = 0;
    }
    else {
      nwsi._4_4_ = sid;
      if (sid == -1) {
        nwsi._4_4_ = (wsi->mux).my_sid;
      }
      _lws_log(8,"%s: sid %d: bump %d -> %d\n","lws_h2_update_peer_txcredit",(ulong)nwsi._4_4_,
               (ulong)(uint)bump,(ulong)(uint)((wsi->txc).peer_tx_cr_est + bump));
      plVar1 = lws_h2_new_pps(LWS_H2_PPS_UPDATE_WINDOW);
      if (plVar1 == (lws_h2_protocol_send *)0x0) {
        wsi_local._4_4_ = 1;
      }
      else {
        (plVar1->u).rs.sid = nwsi._4_4_;
        (plVar1->u).rs.err = bump;
        (wsi->txc).peer_tx_cr_est = bump + (wsi->txc).peer_tx_cr_est;
        lws_wsi_txc_describe(&wsi->txc,"lws_h2_update_peer_txcredit",(wsi->mux).my_sid);
        lws_pps_schedule(wsi,plVar1);
        plVar1 = lws_h2_new_pps(LWS_H2_PPS_UPDATE_WINDOW);
        if (plVar1 == (lws_h2_protocol_send *)0x0) {
          wsi_local._4_4_ = 1;
        }
        else {
          (plVar1->u).rs.sid = 0;
          (plVar1->u).rs.err = bump;
          (wsi_00->txc).peer_tx_cr_est = bump + (wsi_00->txc).peer_tx_cr_est;
          lws_wsi_txc_describe(&wsi_00->txc,"lws_h2_update_peer_txcredit",(wsi_00->mux).my_sid);
          lws_pps_schedule(wsi_00,plVar1);
          wsi_local._4_4_ = 0;
        }
      }
    }
    return wsi_local._4_4_;
  }
  __assert_fail("wsi",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/h2/http2.c"
                ,0x9f,"int lws_h2_update_peer_txcredit(struct lws *, int, int)");
}

Assistant:

int
lws_h2_update_peer_txcredit(struct lws *wsi, int sid, int bump)
{
	struct lws *nwsi = lws_get_network_wsi(wsi);
	struct lws_h2_protocol_send *pps;

	assert(wsi);

	if (!bump)
		return 0;

	if (sid == -1)
		sid = wsi->mux.my_sid;

	lwsl_info("%s: sid %d: bump %d -> %d\n", __func__, sid, bump,
			(int)wsi->txc.peer_tx_cr_est + bump);

	pps = lws_h2_new_pps(LWS_H2_PPS_UPDATE_WINDOW);
	if (!pps)
		return 1;

	pps->u.update_window.sid = sid;
	pps->u.update_window.credit = bump;
	wsi->txc.peer_tx_cr_est += bump;

	lws_wsi_txc_describe(&wsi->txc, __func__, wsi->mux.my_sid);

	lws_pps_schedule(wsi, pps);

	pps = lws_h2_new_pps(LWS_H2_PPS_UPDATE_WINDOW);
	if (!pps)
		return 1;

	pps->u.update_window.sid = 0;
	pps->u.update_window.credit = bump;
	nwsi->txc.peer_tx_cr_est += bump;

	lws_wsi_txc_describe(&nwsi->txc, __func__, nwsi->mux.my_sid);

	lws_pps_schedule(nwsi, pps);

	return 0;
}